

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_scanner_tokenAsString(sysbvm_context_t *context,size_t stringSize,uint8_t *string)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  size_t stringSize_00;
  
  if (stringSize < 2) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/scanner.c:109: assertion failure: stringSize >= 2"
              );
    uVar1 = stringSize | 0xfffffffffffffffe;
  }
  else {
    uVar1 = stringSize - 2;
    if (uVar1 == 0) {
      sVar2 = sysbvm_string_createEmptyWithSize(context,0);
      return sVar2;
    }
  }
  stringSize_00 = 0;
  uVar3 = 0;
  do {
    stringSize_00 = stringSize_00 + 1;
    uVar3 = uVar3 + (string[uVar3 + 1] == '\\') + 1;
  } while (uVar3 < uVar1);
  sVar2 = sysbvm_string_createEmptyWithSize(context,stringSize_00);
  if (1 < stringSize - 1) {
    puVar4 = (uint8_t *)(sVar2 + 0x10);
    uVar1 = 1;
    do {
      uVar5 = string[uVar1];
      if (uVar5 == '\\') {
        uVar5 = string[uVar1 + 1];
        uVar1 = uVar1 + 1;
        if (uVar5 == 'n') {
          uVar5 = '\n';
        }
        else if (uVar5 == 't') {
          uVar5 = '\t';
        }
        else if (uVar5 == 'r') {
          uVar5 = '\r';
        }
      }
      *puVar4 = uVar5;
      puVar4 = puVar4 + 1;
      uVar1 = uVar1 + 1;
    } while (uVar1 < stringSize - 1);
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_scanner_tokenAsString(sysbvm_context_t *context, size_t stringSize, const uint8_t *string)
{
    SYSBVM_ASSERT(stringSize >= 2);

    size_t requiredStringSize = countSizeRequiredForString(stringSize - 2, string + 1);
    sysbvm_tuple_t allocatedString = sysbvm_string_createEmptyWithSize(context, requiredStringSize);
    uint8_t *destination = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(allocatedString)->bytes;
    for(size_t i = 1; i < stringSize - 1; ++i)
    {
        uint8_t c = string[i];
        if(c == '\\')
        {
            ++i;
            c = string[i];
            switch(c)
            {
            case 't':
                *destination++ = '\t';
                break;
            case 'r':
                *destination++ = '\r';
                break;
            case 'n':
                *destination++ = '\n';
                break;
            default:
                *destination++ = c;
                break;
            }
        }
        else
        {
            *destination++ = c;
        }
    }

    return allocatedString;
}